

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_io.c
# Opt level: O0

int unix_timeout_read_func(void *conn,void *buffer,size_t length,int *errno_p,char **result_p)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  undefined8 *in_R8;
  int lerrno_1;
  int lerrno;
  int fdflags;
  int fd;
  int iget;
  int count;
  int left;
  int local_3c;
  int local_38;
  int local_34;
  int local_4;
  
  local_38 = 2;
  uVar1 = fcntl(in_EDI,3,0);
  iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 | 0x800));
  if (iVar2 == -1) {
    perror("fcntl block");
  }
  sVar3 = read(in_EDI,in_RSI,in_RDX);
  local_3c = (int)sVar3;
  if (local_3c == 0) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "End of file";
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
    iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 & 0xfffff7ff));
    if (iVar2 == -1) {
      perror("fcntl nonblock");
    }
    local_4 = 0;
  }
  else {
    if (local_3c == -1) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (in_RCX != (int *)0x0) {
        *in_RCX = iVar2;
      }
      if (((iVar2 != 0xb) && (iVar2 != 0xb)) && (iVar2 != 4)) {
        iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 & 0xfffff7ff));
        if (iVar2 == -1) {
          perror("fcntl nonblock");
        }
        return -1;
      }
      if (in_RCX != (int *)0x0) {
        *in_RCX = 0;
      }
      local_3c = 0;
    }
    local_4 = (int)in_RDX;
    for (local_34 = local_4 - local_3c; 0 < local_34; local_34 = local_34 - local_3c) {
      local_38 = local_38 + -1;
      if (local_38 < 1) {
        iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 & 0xfffff7ff));
        if (iVar2 == -1) {
          perror("fcntl nonblock");
        }
        return -1;
      }
      sleep(1);
      sVar3 = read(in_EDI,(void *)((long)in_RSI + (in_RDX - (long)local_34)),(long)local_34);
      local_3c = (int)sVar3;
      if (local_3c == 0) {
        if (in_R8 != (undefined8 *)0x0) {
          *in_R8 = "End of file";
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = 0;
        }
        iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 & 0xfffff7ff));
        if (iVar2 == -1) {
          perror("fcntl nonblock");
        }
        return local_4 - local_34;
      }
      if (local_3c == -1) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        if (in_RCX != (int *)0x0) {
          piVar4 = __errno_location();
          *in_RCX = *piVar4;
        }
        if (((iVar2 != 0xb) && (iVar2 != 0xb)) && (iVar2 != 4)) {
          iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 & 0xfffff7ff));
          if (iVar2 == -1) {
            perror("fcntl nonblock");
          }
          return local_4 - local_34;
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = 0;
        }
        local_3c = 0;
      }
    }
    iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 & 0xfffff7ff));
    if (iVar2 == -1) {
      perror("fcntl nonblock");
    }
  }
  return local_4;
}

Assistant:

int
unix_timeout_read_func(void *conn, void *buffer, size_t length, int *errno_p, char **result_p)
{
    int left = length;
    int count = 2;
    int iget;
    int fd = (int) (long) conn;
    int fdflags = fcntl(fd, F_GETFL, 0);

    fdflags |= O_NONBLOCK;
    if (fcntl(fd, F_SETFL, fdflags) == -1) 
	perror("fcntl block");
    iget = read(fd, (char *) buffer, length);
    if (iget == 0) {
	if (result_p) *result_p = "End of file";
	if (errno_p) *errno_p = 0;
	fdflags &= ~O_NONBLOCK;
	if (fcntl(fd, F_SETFL, fdflags) == -1) 
	    perror("fcntl nonblock");
	return 0;		/* end of file */
    } else if (iget == -1) {
	int lerrno = errno;
	if (errno_p) *errno_p = lerrno;
	if ((lerrno != EWOULDBLOCK) &&
	    (lerrno != EAGAIN) &&
	    (lerrno != EINTR)) {
	    /* serious error */
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return -1;
	} else {
	    if (errno_p) *errno_p = 0;
	    iget = 0;
	}
    }
    left = length - iget;
    while (left > 0) {
	count--;
	if (count <= 0) {
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return -1;
	}
	sleep(1);
	iget = read(fd, (char *) buffer + length - left, left);
	if (iget == 0) {
	    if (result_p) *result_p = "End of file";
	    if (errno_p) *errno_p = 0;
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return length - left;	/* end of file */
	} else if (iget == -1) {
	    int lerrno = errno;
	    if (errno_p) *errno_p = errno;
	    if ((lerrno != EWOULDBLOCK) &&
		(lerrno != EAGAIN) &&
		(lerrno != EINTR)) {
		/* serious error */
		fdflags &= ~O_NONBLOCK;
		if (fcntl(fd, F_SETFL, fdflags) == -1) 
		    perror("fcntl nonblock");
		return (length - left);
	    } else {
		if (errno_p) *errno_p = 0;
		iget = 0;
	    }
	}
	left -= iget;
    }
    fdflags &= ~O_NONBLOCK;
    if (fcntl(fd, F_SETFL, fdflags) == -1) 
	perror("fcntl nonblock");
    return length;
}